

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

Loop * __thiscall
spvtools::opt::LoopUtils::CloneLoop
          (LoopUtils *this,LoopCloningResult *cloning_result,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  Instruction *this_00;
  LoopUtils *pLVar3;
  BasicBlock *pBVar4;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> uVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  CFG *this_01;
  mapped_type *ppBVar9;
  mapped_type *pmVar10;
  mapped_type *ppIVar11;
  pointer puVar12;
  Instruction *insn;
  Instruction **ppIVar13;
  BasicBlock *__range3;
  Instruction *local_a0;
  LoopUtils *local_98;
  BasicBlock *new_bb;
  undefined8 local_88;
  code *local_80;
  code *local_78;
  pointer local_70;
  pointer local_68;
  DefUseManager *local_60;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> new_loop;
  
  local_60 = IRContext::get_def_use_mgr(this->context_);
  MakeUnique<spvtools::opt::Loop,spvtools::opt::IRContext*const&>
            ((spvtools *)&new_loop,&this->context_);
  local_98 = this;
  this_01 = IRContext::cfg(this->context_);
  local_70 = (pointer)(ordered_loop_blocks->
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
  puVar12 = (pointer)(ordered_loop_blocks->
                     super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
  while (pLVar3 = local_98, puVar12 != local_70) {
    pBVar1 = (puVar12->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    local_68 = puVar12;
    new_bb = BasicBlock::Clone(pBVar1,local_98->context_);
    new_bb->function_ = pLVar3->function_;
    pIVar2 = (new_bb->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar7 = IRContext::TakeNextId(pLVar3->context_);
    Instruction::SetResultId(pIVar2,uVar7);
    analysis::DefUseManager::AnalyzeInstDef
              (local_60,(new_bb->label_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
    IRContext::set_instr_block
              (pLVar3->context_,
               (new_bb->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,new_bb);
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::emplace_back<spvtools::opt::BasicBlock*&>
              ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)&cloning_result->cloned_bb_,&new_bb);
    pBVar4 = new_bb;
    uVar7 = BasicBlock::id(pBVar1);
    local_a0._0_4_ = uVar7;
    ppBVar9 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&cloning_result->old_to_new_bb_,(key_type *)&local_a0);
    *ppBVar9 = pBVar4;
    local_a0._0_4_ = BasicBlock::id(new_bb);
    ppBVar9 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&cloning_result->new_to_old_bb_,(key_type *)&local_a0);
    *ppBVar9 = pBVar1;
    uVar7 = BasicBlock::id(new_bb);
    uVar8 = BasicBlock::id(pBVar1);
    local_a0 = (Instruction *)CONCAT44(local_a0._4_4_,uVar8);
    pmVar10 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&cloning_result->value_map_,(key_type *)&local_a0);
    *pmVar10 = uVar7;
    bVar6 = Loop::IsInsideLoop(pLVar3->loop_,pBVar1);
    if (bVar6) {
      Loop::AddBasicBlock((Loop *)new_loop._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                  .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                          new_bb);
    }
    pIVar2 = &(new_bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    ppIVar13 = (Instruction **)
               ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_ +
               8);
    while (pIVar2 = *(Instruction **)
                     ((long)&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          pIVar2 != &(new_bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      this_00 = *ppIVar13;
      local_a0 = pIVar2;
      ppIVar11 = std::__detail::
                 _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)cloning_result,&local_a0);
      *ppIVar11 = this_00;
      if (pIVar2->has_result_id_ == true) {
        uVar7 = IRContext::TakeNextId(local_98->context_);
        Instruction::SetResultId(pIVar2,uVar7);
        uVar7 = Instruction::result_id(pIVar2);
        uVar8 = Instruction::result_id(this_00);
        local_a0 = (Instruction *)CONCAT44(local_a0._4_4_,uVar8);
        pmVar10 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&cloning_result->value_map_,(key_type *)&local_a0);
        *pmVar10 = uVar7;
        analysis::DefUseManager::AnalyzeInstDef(local_60,pIVar2);
      }
      ppIVar13 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    puVar12 = local_68 + 1;
  }
  local_70 = (cloning_result->cloned_bb_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  puVar12 = (cloning_result->cloned_bb_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (puVar12 != local_70) {
    pBVar1 = (puVar12->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar13 = (Instruction **)
               ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    local_68 = puVar12;
    while (pIVar2 = *ppIVar13,
          pIVar2 != (Instruction *)
                    ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    {
      local_88 = 0;
      local_78 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:598:24)>
                 ::_M_invoke;
      local_80 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:598:24)>
                 ::_M_manager;
      new_bb = (BasicBlock *)cloning_result;
      Instruction::ForEachInId(pIVar2,(function<void_(unsigned_int_*)> *)&new_bb);
      if (local_80 != (code *)0x0) {
        (*local_80)((_Any_data *)&new_bb,(_Any_data *)&new_bb,__destroy_functor);
      }
      analysis::DefUseManager::AnalyzeInstUse(local_60,pIVar2);
      IRContext::set_instr_block(local_98->context_,pIVar2,pBVar1);
      ppIVar13 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    CFG::RegisterBlock(this_01,pBVar1);
    puVar12 = local_68 + 1;
  }
  PopulateLoopNest(local_98,(Loop *)new_loop._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                    .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>.
                                    _M_head_impl,cloning_result);
  uVar5 = new_loop;
  new_loop._M_t.
  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
  super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>)
       (__uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>)0x0;
  std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
            (&new_loop);
  return (Loop *)(__uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>)
                 uVar5._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                 .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl;
}

Assistant:

Loop* LoopUtils::CloneLoop(
    LoopCloningResult* cloning_result,
    const std::vector<BasicBlock*>& ordered_loop_blocks) const {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  std::unique_ptr<Loop> new_loop = MakeUnique<Loop>(context_);

  CFG& cfg = *context_->cfg();

  // Clone and place blocks in a SPIR-V compliant order (dominators first).
  for (BasicBlock* old_bb : ordered_loop_blocks) {
    // For each basic block in the loop, we clone it and register the mapping
    // between old and new ids.
    BasicBlock* new_bb = old_bb->Clone(context_);
    new_bb->SetParent(&function_);
    // TODO(1841): Handle id overflow.
    new_bb->GetLabelInst()->SetResultId(context_->TakeNextId());
    def_use_mgr->AnalyzeInstDef(new_bb->GetLabelInst());
    context_->set_instr_block(new_bb->GetLabelInst(), new_bb);
    cloning_result->cloned_bb_.emplace_back(new_bb);

    cloning_result->old_to_new_bb_[old_bb->id()] = new_bb;
    cloning_result->new_to_old_bb_[new_bb->id()] = old_bb;
    cloning_result->value_map_[old_bb->id()] = new_bb->id();

    if (loop_->IsInsideLoop(old_bb)) new_loop->AddBasicBlock(new_bb);

    for (auto new_inst = new_bb->begin(), old_inst = old_bb->begin();
         new_inst != new_bb->end(); ++new_inst, ++old_inst) {
      cloning_result->ptr_map_[&*new_inst] = &*old_inst;
      if (new_inst->HasResultId()) {
        // TODO(1841): Handle id overflow.
        new_inst->SetResultId(context_->TakeNextId());
        cloning_result->value_map_[old_inst->result_id()] =
            new_inst->result_id();

        // Only look at the defs for now, uses are not updated yet.
        def_use_mgr->AnalyzeInstDef(&*new_inst);
      }
    }
  }

  // All instructions (including all labels) have been cloned,
  // remap instruction operands id with the new ones.
  for (std::unique_ptr<BasicBlock>& bb_ref : cloning_result->cloned_bb_) {
    BasicBlock* bb = bb_ref.get();

    for (Instruction& insn : *bb) {
      insn.ForEachInId([cloning_result](uint32_t* old_id) {
        // If the operand is defined in the loop, remap the id.
        auto id_it = cloning_result->value_map_.find(*old_id);
        if (id_it != cloning_result->value_map_.end()) {
          *old_id = id_it->second;
        }
      });
      // Only look at what the instruction uses. All defs are register, so all
      // should be fine now.
      def_use_mgr->AnalyzeInstUse(&insn);
      context_->set_instr_block(&insn, bb);
    }
    cfg.RegisterBlock(bb);
  }

  PopulateLoopNest(new_loop.get(), *cloning_result);

  return new_loop.release();
}